

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

int add_tpl_ref_mv(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,MV_REFERENCE_FRAME ref_frame
                  ,int blk_row,int blk_col,int_mv *gm_mv_candidates,uint8_t *refmv_count,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,int16_t *mode_context)

{
  _Bool _Var1;
  _Bool _Var2;
  MV MVar3;
  int iVar4;
  SequenceHeader *pSVar5;
  undefined1 auVar6 [14];
  ushort uVar7;
  long lVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  short sVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  bool bVar25;
  
  iVar14 = (mi_row | 1U) + blk_row;
  if (iVar14 < (xd->tile).mi_row_start) {
    return 0;
  }
  iVar21 = (~mi_col & 1U) + blk_col + mi_col;
  if (iVar21 < (xd->tile).mi_col_start) {
    return 0;
  }
  if ((xd->tile).mi_row_end <= iVar14) {
    return 0;
  }
  if ((xd->tile).mi_col_end <= iVar21) {
    return 0;
  }
  iVar14 = ((cm->mi_params).mi_stride >> 1) * (iVar14 >> 1);
  MVar3 = cm->tpl_mvs[(long)iVar14 + (long)(iVar21 >> 1)].mfmv0.as_mv;
  if (MVar3 == (MV)0x80008000) {
    return 0;
  }
  bVar20 = 0xff;
  bVar9 = ref_frame;
  if ('\a' < ref_frame) {
    bVar9 = ref_frame_map[(byte)ref_frame - 8][0];
    bVar20 = ref_frame_map[(byte)ref_frame - 8][1];
  }
  iVar23 = -1;
  if ((byte)(bVar9 - 1) < 8) {
    iVar23 = cm->remapped_ref_idx[bVar9 - 1];
  }
  uVar11 = cm->cur_frame->order_hint;
  pSVar5 = cm->seq_params;
  iVar4 = (pSVar5->order_hint_info).enable_order_hint;
  if (iVar4 == 0) {
    iVar23 = 0;
  }
  else {
    uVar24 = uVar11 - cm->ref_frame_map[iVar23]->order_hint;
    uVar22 = 1 << ((byte)(pSVar5->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    iVar23 = (uVar22 - 1 & uVar24) - (uVar22 & uVar24);
  }
  uVar22 = (uint)cm->tpl_mvs[(long)iVar14 + (long)(iVar21 >> 1)].ref_frame_offset;
  if (0x1e < uVar22) {
    uVar22 = 0x1f;
  }
  if (iVar23 < 1) {
    iVar14 = -0x1f;
    if (-0x1f < iVar23) {
      iVar14 = iVar23;
    }
  }
  else {
    iVar14 = 0x1f;
    if (iVar23 < 0x1f) {
      iVar14 = iVar23;
    }
  }
  iVar14 = iVar14 * div_mult[uVar22];
  iVar21 = iVar14 * MVar3.row;
  if (iVar21 < 0) {
    uVar24 = -(0x2000U - iVar21 >> 0xe);
  }
  else {
    uVar24 = iVar21 + 0x2000U >> 0xe;
  }
  _Var1 = (cm->features).cur_frame_force_integer_mv;
  iVar14 = iVar14 * ((int)MVar3 >> 0x10);
  if (iVar14 < 0) {
    uVar12 = -(0x2000U - iVar14 >> 0xe);
  }
  else {
    uVar12 = iVar14 + 0x2000U >> 0xe;
  }
  _Var2 = (cm->features).allow_high_precision_mv;
  uVar17 = 0x3fff;
  if ((int)uVar24 < 0x3fff) {
    uVar17 = uVar24;
  }
  if ((int)uVar17 < -0x3ffe) {
    uVar17 = 0xffffc001;
  }
  uVar18 = (ulong)uVar17;
  uVar16 = 0x3fff;
  if ((int)uVar12 < 0x3fff) {
    uVar16 = uVar12;
  }
  if ((int)uVar16 < -0x3ffe) {
    uVar16 = 0xffffc001;
  }
  if (_Var1 == false) {
    if ((_Var2 == false) &&
       (uVar18 = (ulong)(((uint)((int)uVar24 < 1) * 2 - 1 & -(uVar17 & 1)) + uVar17),
       (uVar16 & 1) != 0)) {
      uVar16 = (uVar16 + (uint)((int)uVar12 < 1) * 2) - 1;
    }
  }
  else {
    uVar24 = (int)uVar17 % 8;
    if (uVar24 != 0) {
      uVar17 = uVar17 - uVar24;
      uVar18 = (ulong)uVar17;
      uVar12 = -uVar24;
      if (0 < (int)uVar24) {
        uVar12 = uVar24;
      }
      if (4 < uVar12) {
        if ((int)uVar24 < 1) {
          uVar18 = (ulong)(uVar17 - 8);
        }
        else {
          uVar18 = (ulong)(uVar17 + 8);
        }
      }
    }
    uVar24 = (int)uVar16 % 8;
    if (uVar24 != 0) {
      uVar16 = uVar16 - uVar24;
      uVar12 = -uVar24;
      if (0 < (int)uVar24) {
        uVar12 = uVar24;
      }
      if (4 < uVar12) {
        if ((int)uVar24 < 1) {
          uVar16 = uVar16 - 8;
        }
        else {
          uVar16 = uVar16 + 8;
        }
      }
    }
  }
  sVar15 = (short)uVar16;
  if (bVar20 != 0xff) {
    iVar14 = -1;
    if ((byte)(bVar20 - 1) < 8) {
      iVar14 = cm->remapped_ref_idx[bVar20 - 1];
    }
    if (iVar4 == 0) {
      iVar14 = 0;
    }
    else {
      uVar11 = uVar11 - cm->ref_frame_map[iVar14]->order_hint;
      uVar24 = 1 << ((byte)(pSVar5->order_hint_info).order_hint_bits_minus_1 & 0x1f);
      iVar14 = (uVar24 - 1 & uVar11) - (uVar24 & uVar11);
    }
    if (iVar14 < 1) {
      iVar21 = -0x1f;
      if (-0x1f < iVar14) {
        iVar21 = iVar14;
      }
    }
    else {
      iVar21 = 0x1f;
      if (iVar14 < 0x1f) {
        iVar21 = iVar14;
      }
    }
    iVar21 = iVar21 * div_mult[uVar22];
    iVar14 = MVar3.row * iVar21;
    if (iVar14 < 0) {
      uVar11 = -(0x2000U - iVar14 >> 0xe);
    }
    else {
      uVar11 = iVar14 + 0x2000U >> 0xe;
    }
    iVar21 = iVar21 * ((int)MVar3 >> 0x10);
    if (iVar21 < 0) {
      uVar22 = -(0x2000U - iVar21 >> 0xe);
    }
    else {
      uVar22 = iVar21 + 0x2000U >> 0xe;
    }
    uVar24 = 0x3fff;
    if ((int)uVar11 < 0x3fff) {
      uVar24 = uVar11;
    }
    if ((int)uVar24 < -0x3ffe) {
      uVar24 = 0xffffc001;
    }
    uVar12 = 0x3fff;
    if ((int)uVar22 < 0x3fff) {
      uVar12 = uVar22;
    }
    if ((int)uVar12 < -0x3ffe) {
      uVar12 = 0xffffc001;
    }
    if (_Var1 == false) {
      if ((_Var2 == false) &&
         (uVar24 = ((uint)((int)uVar11 < 1) * 2 - 1 & -(uVar24 & 1)) + uVar24, (uVar12 & 1) != 0)) {
        uVar12 = (uVar12 + (uint)((int)uVar22 < 1) * 2) - 1;
      }
    }
    else {
      uVar11 = uVar24 + 7;
      if (-1 < (int)uVar24) {
        uVar11 = uVar24;
      }
      uVar11 = uVar24 - (uVar11 & 0xfffffff8);
      if (uVar11 != 0) {
        uVar24 = uVar24 - uVar11;
        uVar22 = -uVar11;
        if (0 < (int)uVar11) {
          uVar22 = uVar11;
        }
        if (4 < uVar22) {
          if ((int)uVar11 < 1) {
            uVar24 = uVar24 - 8;
          }
          else {
            uVar24 = uVar24 + 8;
          }
        }
      }
      uVar11 = (int)uVar12 % 8;
      if (uVar11 != 0) {
        uVar12 = uVar12 - uVar11;
        uVar22 = -uVar11;
        if (0 < (int)uVar11) {
          uVar22 = uVar11;
        }
        if (4 < uVar22) {
          if ((int)uVar11 < 1) {
            uVar12 = uVar12 - 8;
          }
          else {
            uVar12 = uVar12 + 8;
          }
        }
      }
    }
    if (blk_col == 0 && blk_row == 0) {
      iVar14 = (int)(short)uVar18 - (int)(gm_mv_candidates->as_mv).row;
      uVar7 = (ushort)iVar14;
      uVar10 = -uVar7;
      if (0 < iVar14) {
        uVar10 = uVar7;
      }
      if (uVar10 < 0x10) {
        iVar14 = (int)sVar15 - (int)(gm_mv_candidates->as_mv).col;
        uVar7 = (ushort)iVar14;
        uVar10 = -uVar7;
        if (0 < iVar14) {
          uVar10 = uVar7;
        }
        if (uVar10 < 0x10) {
          iVar14 = (int)(short)uVar24 - (int)gm_mv_candidates[1].as_mv.row;
          uVar7 = (ushort)iVar14;
          uVar10 = -uVar7;
          if (0 < iVar14) {
            uVar10 = uVar7;
          }
          if (uVar10 < 0x10) {
            iVar14 = (int)(short)(ushort)uVar12 - (int)*(short *)((long)gm_mv_candidates + 6);
            uVar7 = (ushort)iVar14;
            uVar10 = -uVar7;
            if (0 < iVar14) {
              uVar10 = uVar7;
            }
            if (uVar10 < 0x10) goto LAB_0039a676;
          }
        }
      }
      *(byte *)(mode_context + ref_frame) = *(byte *)(mode_context + ref_frame) | 8;
    }
LAB_0039a676:
    bVar9 = *refmv_count;
    uVar11 = (uint)bVar9;
    bVar25 = bVar9 != 0;
    if (bVar9 == 0) {
      uVar11 = 0;
    }
    else {
      uVar19 = 0;
      do {
        if (((uVar16 << 0x10 | (uint)(uVar18 & 0xffff)) == ref_mv_stack[uVar19].this_mv.as_int) &&
           ((uVar24 & 0xffff | uVar12 << 0x10) == ref_mv_stack[uVar19].comp_mv.as_int)) {
          if (bVar25) {
            ref_mv_weight[uVar19] = ref_mv_weight[uVar19] + 2;
          }
          uVar11 = (uint)uVar19;
          break;
        }
        uVar19 = uVar19 + 1;
        bVar25 = uVar19 < bVar9;
      } while (bVar9 != uVar19);
    }
    if (7 < *refmv_count) {
      return 1;
    }
    if (uVar11 != *refmv_count) {
      return 1;
    }
    uVar19 = (ulong)uVar11;
    auVar6._2_12_ = SUB1612(ZEXT216((ushort)uVar12) << 0x30,4);
    auVar6._0_2_ = sVar15;
    ref_mv_stack[uVar19] =
         (CANDIDATE_MV)(auVar6._0_8_ << 0x10 | uVar18 & 0xffff | (ulong)(uVar24 & 0xffff) << 0x20);
    goto LAB_0039a711;
  }
  if (blk_col == 0 && blk_row == 0) {
    iVar14 = (int)(short)uVar18 - (int)(gm_mv_candidates->as_mv).row;
    uVar7 = (ushort)iVar14;
    uVar10 = -uVar7;
    if (0 < iVar14) {
      uVar10 = uVar7;
    }
    if (uVar10 < 0x10) {
      iVar14 = (int)sVar15 - (int)(gm_mv_candidates->as_mv).col;
      uVar7 = (ushort)iVar14;
      uVar10 = -uVar7;
      if (0 < iVar14) {
        uVar10 = uVar7;
      }
      if (uVar10 < 0x10) goto LAB_0039a415;
    }
    *(byte *)(mode_context + ref_frame) = *(byte *)(mode_context + ref_frame) | 8;
  }
LAB_0039a415:
  bVar9 = *refmv_count;
  bVar25 = bVar9 != 0;
  if (bVar9 == 0) {
    uVar11 = 0;
  }
  else {
    uVar22 = (uint)uVar18 & 0xffff | uVar16 << 0x10;
    if (uVar22 == (ref_mv_stack->this_mv).as_int) {
      uVar13 = 0;
    }
    else {
      uVar11 = (uint)bVar9;
      uVar19 = 0;
      do {
        if ((ulong)uVar11 - 1 == uVar19) goto LAB_0039a59f;
        uVar13 = uVar19 + 1;
        lVar8 = uVar19 + 1;
        uVar19 = uVar13;
      } while (uVar22 != ref_mv_stack[lVar8].this_mv.as_int);
      bVar25 = uVar13 < bVar9;
    }
    uVar11 = (uint)uVar13;
    if (bVar25) {
      ref_mv_weight[uVar13 & 0xffffffff] = ref_mv_weight[uVar13 & 0xffffffff] + 2;
    }
  }
LAB_0039a59f:
  if (7 < *refmv_count) {
    return 1;
  }
  if (uVar11 != *refmv_count) {
    return 1;
  }
  uVar19 = (ulong)uVar11;
  ref_mv_stack[uVar19].this_mv.as_int = (uint)uVar18 & 0xffff | uVar16 << 0x10;
LAB_0039a711:
  ref_mv_weight[uVar19] = 2;
  *refmv_count = *refmv_count + '\x01';
  return 1;
}

Assistant:

static int add_tpl_ref_mv(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                          int mi_row, int mi_col, MV_REFERENCE_FRAME ref_frame,
                          int blk_row, int blk_col, int_mv *gm_mv_candidates,
                          uint8_t *const refmv_count,
                          CANDIDATE_MV ref_mv_stack[MAX_REF_MV_STACK_SIZE],
                          uint16_t ref_mv_weight[MAX_REF_MV_STACK_SIZE],
                          int16_t *mode_context) {
  POSITION mi_pos;
  mi_pos.row = (mi_row & 0x01) ? blk_row : blk_row + 1;
  mi_pos.col = (mi_col & 0x01) ? blk_col : blk_col + 1;

  if (!is_inside(&xd->tile, mi_col, mi_row, &mi_pos)) return 0;

  const TPL_MV_REF *prev_frame_mvs =
      cm->tpl_mvs +
      ((mi_row + mi_pos.row) >> 1) * (cm->mi_params.mi_stride >> 1) +
      ((mi_col + mi_pos.col) >> 1);
  if (prev_frame_mvs->mfmv0.as_int == INVALID_MV) return 0;

  MV_REFERENCE_FRAME rf[2];
  av1_set_ref_frame(rf, ref_frame);

  const uint16_t weight_unit = 1;  // mi_size_wide[BLOCK_8X8];
  const int cur_frame_index = cm->cur_frame->order_hint;
  const RefCntBuffer *const buf_0 = get_ref_frame_buf(cm, rf[0]);
  const int frame0_index = buf_0->order_hint;
  const int cur_offset_0 = get_relative_dist(&cm->seq_params->order_hint_info,
                                             cur_frame_index, frame0_index);
  int idx;
  const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
  const int force_integer_mv = cm->features.cur_frame_force_integer_mv;

  int_mv this_refmv;
  get_mv_projection(&this_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                    cur_offset_0, prev_frame_mvs->ref_frame_offset);
  lower_mv_precision(&this_refmv.as_mv, allow_high_precision_mv,
                     force_integer_mv);

  if (rf[1] == NONE_FRAME) {
    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx)
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int) break;

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  } else {
    // Process compound inter mode
    const RefCntBuffer *const buf_1 = get_ref_frame_buf(cm, rf[1]);
    const int frame1_index = buf_1->order_hint;
    const int cur_offset_1 = get_relative_dist(&cm->seq_params->order_hint_info,
                                               cur_frame_index, frame1_index);
    int_mv comp_refmv;
    get_mv_projection(&comp_refmv.as_mv, prev_frame_mvs->mfmv0.as_mv,
                      cur_offset_1, prev_frame_mvs->ref_frame_offset);
    lower_mv_precision(&comp_refmv.as_mv, allow_high_precision_mv,
                       force_integer_mv);

    if (blk_row == 0 && blk_col == 0) {
      if (abs(this_refmv.as_mv.row - gm_mv_candidates[0].as_mv.row) >= 16 ||
          abs(this_refmv.as_mv.col - gm_mv_candidates[0].as_mv.col) >= 16 ||
          abs(comp_refmv.as_mv.row - gm_mv_candidates[1].as_mv.row) >= 16 ||
          abs(comp_refmv.as_mv.col - gm_mv_candidates[1].as_mv.col) >= 16)
        mode_context[ref_frame] |= (1 << GLOBALMV_OFFSET);
    }

    for (idx = 0; idx < *refmv_count; ++idx) {
      if (this_refmv.as_int == ref_mv_stack[idx].this_mv.as_int &&
          comp_refmv.as_int == ref_mv_stack[idx].comp_mv.as_int)
        break;
    }

    if (idx < *refmv_count) ref_mv_weight[idx] += 2 * weight_unit;

    if (idx == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
      ref_mv_stack[idx].this_mv.as_int = this_refmv.as_int;
      ref_mv_stack[idx].comp_mv.as_int = comp_refmv.as_int;
      ref_mv_weight[idx] = 2 * weight_unit;
      ++(*refmv_count);
    }
  }

  return 1;
}